

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O3

void ym2612_reset_chip(void *chip)

{
  FM_OPN *OPN;
  int *piVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  long lVar13;
  byte bVar14;
  UINT8 *pUVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  double dVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  
  if (*(uint *)((long)chip + 0x224) == 0) {
    dVar19 = 0.0;
  }
  else {
    dVar19 = ((double)*(uint *)((long)chip + 0x220) / (double)*(uint *)((long)chip + 0x224)) / 144.0
    ;
  }
  OPN = (FM_OPN *)((long)chip + 0x200);
  *(double *)((long)chip + 0x210) = dVar19;
  *(int *)((long)chip + 0x6c0) = (int)(long)(dVar19 * 65536.0);
  *(undefined4 *)((long)chip + 0x6c4) = 0x30000;
  *(int *)((long)chip + 0x46d4) = (int)(long)(dVar19 * 16777216.0);
  *(undefined4 *)((long)chip + 0x218) = 0x90;
  lVar13 = (long)chip + 0x444;
  pUVar15 = "";
  lVar16 = 0;
  do {
    lVar18 = 0;
    do {
      uVar4 = *(undefined4 *)(pUVar15 + lVar18);
      uVar8 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar8;
      auVar5[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar6[8] = (char)((uint)uVar4 >> 0x10);
      auVar6._0_8_ = uVar8;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar9._5_8_ = 0;
      auVar9._0_5_ = auVar6._8_5_;
      auVar7[4] = (char)((uint)uVar4 >> 8);
      auVar7._0_4_ = (int)uVar8;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar9 << 0x40,6);
      iVar20 = (int)((double)(int)uVar8 * dVar19 * 64.0);
      iVar21 = (int)((double)auVar7._4_4_ * dVar19 * 64.0);
      iVar22 = (int)((double)auVar6._8_4_ * dVar19 * 64.0);
      iVar23 = (int)((double)(uint3)(auVar5._10_3_ >> 0x10) * dVar19 * 64.0);
      puVar3 = (undefined8 *)(lVar13 + -0x200 + lVar18 * 4);
      *puVar3 = CONCAT44(iVar21,iVar20);
      puVar3[1] = CONCAT44(iVar23,iVar22);
      piVar1 = (int *)(lVar13 + lVar18 * 4);
      *piVar1 = -iVar20;
      piVar1[1] = -iVar21;
      piVar1[2] = -iVar22;
      piVar1[3] = -iVar23;
      auVar11 = _DAT_001b26e0;
      auVar10 = _DAT_001b26a0;
      lVar18 = lVar18 + 4;
    } while (lVar18 != 0x20);
    lVar16 = lVar16 + 1;
    pUVar15 = pUVar15 + 0x20;
    lVar13 = lVar13 + 0x80;
  } while (lVar16 != 4);
  iVar20 = 0;
  iVar21 = 1;
  iVar22 = 2;
  iVar23 = 3;
  lVar13 = 0x1b2;
  do {
    auVar25._4_4_ = 0;
    auVar25._0_4_ = iVar20 << 5;
    auVar25._8_4_ = iVar21 << 5;
    auVar25._12_4_ = 0;
    auVar28._4_4_ = 0;
    auVar28._0_4_ = iVar22 << 5;
    auVar28._8_4_ = iVar23 << 5;
    auVar28._12_4_ = 0;
    dVar24 = (SUB168(auVar25 | auVar10,0) - auVar10._0_8_) * dVar19 * 64.0;
    dVar26 = (SUB168(auVar25 | auVar10,8) - auVar10._8_8_) * dVar19 * 64.0;
    dVar27 = (SUB168(auVar28 | auVar10,0) - auVar10._0_8_) * dVar19 * 64.0;
    dVar29 = (SUB168(auVar28 | auVar10,8) - auVar10._8_8_) * dVar19 * 64.0;
    iVar30 = (int)dVar27;
    iVar32 = (int)dVar29;
    iVar31 = (int)dVar24;
    iVar33 = (int)dVar26;
    puVar2 = (ulong *)((long)chip + lVar13 * 4);
    *puVar2 = CONCAT44((int)(dVar26 - 2147483648.0),(int)(dVar24 - 2147483648.0)) &
              CONCAT44(iVar33 >> 0x1f,iVar31 >> 0x1f) | CONCAT44(iVar33,iVar31);
    puVar2[1] = CONCAT44((int)(dVar29 - 2147483648.0),(int)(dVar27 - 2147483648.0)) &
                CONCAT44(iVar32 >> 0x1f,iVar30 >> 0x1f) | CONCAT44(iVar32,iVar30);
    iVar20 = iVar20 + auVar11._0_4_;
    iVar21 = iVar21 + auVar11._4_4_;
    iVar22 = iVar22 + auVar11._8_4_;
    iVar23 = iVar23 + auVar11._12_4_;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x11b2);
  *(int *)((long)chip + 0x46c8) = (int)(long)(dVar19 * 131072.0 * 64.0);
  *(undefined1 *)((long)chip + 0x21d) = 3;
  bVar14 = *(byte *)((long)chip + 0x229);
  bVar12 = 3;
  if (*(char *)((long)chip + 0x21c) == '\0') {
    if ((bVar14 & 3) == 0) goto LAB_0016e6c6;
    *(undefined1 *)((long)chip + 0x21c) = 1;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x208));
      if (*(char *)((long)chip + 0x21c) == '\0') goto LAB_0016e6c6;
      bVar12 = *(byte *)((long)chip + 0x21d);
      bVar14 = *(byte *)((long)chip + 0x229);
    }
  }
  if ((bVar14 & bVar12) == 0) {
    *(undefined1 *)((long)chip + 0x21c) = 0;
    if (*(code **)((long)chip + 0x650) != (code *)0x0) {
      (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x208));
    }
  }
LAB_0016e6c6:
  *(undefined8 *)((long)chip + 0x6b8) = 0;
  *(undefined4 *)((long)chip + 0x238) = 0;
  *(undefined4 *)((long)chip + 0x240) = 0;
  *(undefined1 *)((long)chip + 0x67c) = 0;
  *(undefined1 *)((long)chip + 0x229) = 0;
  *(undefined4 *)((long)chip + 0x22c) = 0;
  memset(chip,0,0x200);
  *(undefined4 *)((long)chip + 0x46d8) = 0;
  *(undefined4 *)((long)chip + 0x46d0) = 0;
  *(undefined1 *)((long)chip + 0x46cc) = 0;
  *(undefined8 *)((long)chip + 0x46dc) = 0x7e;
  OPNWriteMode(OPN,0x27,0x30);
  *(undefined1 *)((long)chip + 0x23c) = 0;
  *(undefined4 *)((long)chip + 0x234) = 0;
  lVar13 = (long)chip + 0x475a;
  lVar16 = 0;
  do {
    lVar18 = lVar16 * 0x1a0;
    *(undefined4 *)((long)chip + lVar18 + 0x4888) = 0;
    *(undefined8 *)((long)chip + lVar18 + 0x4854) = 0;
    *(undefined4 *)((long)chip + lVar18 + 0x4894) = 0;
    lVar18 = 0;
    do {
      *(undefined1 *)(lVar13 + lVar18) = 0;
      *(undefined8 *)(lVar13 + -0x26 + lVar18) = 0xffffffff00000000;
      *(undefined2 *)(lVar13 + -2 + lVar18) = 0;
      *(undefined1 *)(lVar13 + -0x1e + lVar18) = 0;
      *(undefined4 *)(lVar13 + -0x16 + lVar18) = 0x3ff;
      *(undefined4 *)(lVar13 + -0xe + lVar18) = 0x3ff;
      lVar18 = lVar18 + 0x50;
    } while (lVar18 != 0x140);
    lVar16 = lVar16 + 1;
    lVar13 = lVar13 + 0x1a0;
  } while (lVar16 != 6);
  uVar17 = 0xb7;
  do {
    uVar17 = uVar17 - 1;
    OPNWriteReg(OPN,uVar17,0xc0);
    OPNWriteReg(OPN,uVar17 | 0x100,0xc0);
  } while (0xb4 < uVar17);
  uVar17 = 0xb3;
  do {
    uVar17 = uVar17 - 1;
    OPNWriteReg(OPN,uVar17,0);
    OPNWriteReg(OPN,uVar17 | 0x100,0);
  } while (0x30 < uVar17);
  *(undefined2 *)((long)chip + 0x50d1) = 0;
  *(undefined4 *)((long)chip + 0x50d4) = 0;
  if (*(char *)((long)chip + 0x50d9) == '\x02') {
    *(undefined1 *)((long)chip + 0x50d9) = 1;
  }
  return;
}

Assistant:

void ym2612_reset_chip(void *chip)
{
	int i;
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN *OPN   = &F2612->OPN;

	OPNSetPres( OPN, 6*24, 6*24, 0);
	/* status clear */
	FM_IRQMASK_SET(&OPN->ST,0x03);
	FM_BUSY_CLEAR(&OPN->ST);
	/* OPNWriteMode(OPN,0x27,0x30); */ /* mode 0 , timer reset */

#if RSM_ENABLE
	/* Resampler's state */
	F2612->OPN.ST.framecnt = 1 << RSM_FRAC;
	memset(&(F2612->OPN.ST.cur_sample), 0x00, sizeof(FMSAMPLE) * 2);
	memset(&(F2612->OPN.ST.prev_sample), 0x00, sizeof(FMSAMPLE) * 2);
#endif

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->lfo_timer = 0;
	OPN->lfo_cnt   = 0;
	OPN->LFO_AM    = 126;
	OPN->LFO_PM    = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;

	memset(F2612->REGS, 0x00, sizeof(UINT8) * 512);

	OPNWriteMode(OPN,0x22,0x00);

	OPNWriteMode(OPN,0x27,0x30);
	OPNWriteMode(OPN,0x26,0x00);
	OPNWriteMode(OPN,0x25,0x00);
	OPNWriteMode(OPN,0x24,0x00);

	reset_channels( &OPN->ST , &F2612->CH[0] , 6 );

	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}

	/* DAC mode clear */
	F2612->dacen = 0;
	F2612->dac_test = 0;
	F2612->dacout = 0;

	if (F2612->WaveOutMode == 0x02)
		F2612->WaveOutMode >>= 1;
}